

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O0

vm_obj_id_t CVmBif::get_charset_obj(vm_val_t *val)

{
  int iVar1;
  char *charset_name;
  char *charset_name_len;
  int *in_RDI;
  char *str;
  vm_val_t *in_stack_ffffffffffffffd8;
  vm_obj_id_t local_4;
  
  if ((*in_RDI == 5) && (iVar1 = CVmObjCharSet::is_charset(0), iVar1 != 0)) {
    return in_RDI[2];
  }
  charset_name = vm_val_t::get_as_string(in_stack_ffffffffffffffd8);
  if (charset_name == (char *)0x0) {
    if (*in_RDI != 1) {
      err_throw(0);
    }
    local_4 = 0;
  }
  else {
    charset_name_len = charset_name + 2;
    vmb_get_len((char *)0x2a09e0);
    local_4 = CVmObjCharSet::create
                        ((int)((ulong)in_RDI >> 0x20),charset_name,(size_t)charset_name_len);
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmBif::get_charset_obj(VMG_ const vm_val_t *val)
{
    const char *str;

    /* 
     *   check to see if it's a CharacterSet object; if it's not, it must be
     *   a string giving the character set name 
     */
    if (val->typ == VM_OBJ && CVmObjCharSet::is_charset(vmg_ val->val.obj))
    {
        /* it's a CharacterSet object - return it */
        return val->val.obj;
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        /* it's a string - create a mapper for the given character set name */
        return CVmObjCharSet::create(
            vmg_ FALSE, str + VMB_LEN, vmb_get_len(str));
    }
    else if (val->typ == VM_NIL)
    {
        /* nil simply means no character set */
        return VM_INVALID_OBJ;
    }
    else
    {
        /* invalid argument */
        err_throw(VMERR_BAD_TYPE_BIF);
        AFTER_ERR_THROW(return VM_INVALID_OBJ);
    }
}